

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  float value;
  double value_00;
  java jVar1;
  string *src;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long *plVar5;
  LogMessage *other;
  undefined8 *puVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  _Alloc_hider in_stack_fffffffffffffdd8;
  _Alloc_hider _Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [2];
  string local_1f0;
  undefined1 local_1d0 [48];
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4)) {
  case 1:
  case 3:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0x70),0x23d470)
    ;
    return __return_storage_ptr__;
  case 2:
    SimpleItoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,*(protobuf **)(this + 0x70),0x23d470);
    plVar5 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdd8);
    local_1f0._M_dataplus._M_p = in_stack_fffffffffffffdd8._M_p;
    break;
  case 4:
    SimpleItoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,*(protobuf **)(this + 0x70),0x23d470);
    plVar5 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdd8);
    local_1f0._M_dataplus._M_p = in_stack_fffffffffffffdd8._M_p;
    break;
  case 5:
    value_00 = *(double *)(this + 0x70);
    if (INFINITY <= value_00) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Double.POSITIVE_INFINITY";
      pcVar9 = "";
      goto LAB_001a21ce;
    }
    if (value_00 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Double.NEGATIVE_INFINITY";
      pcVar9 = "";
      goto LAB_001a21ce;
    }
    if (NAN(value_00)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Double.NaN";
      pcVar9 = "";
      goto LAB_001a21ce;
    }
    SimpleDtoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,(protobuf *)this,value_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"D");
    local_1f0._M_dataplus._M_p = in_stack_fffffffffffffdd8._M_p;
    goto LAB_001a20b2;
  case 6:
    value = *(float *)(this + 0x70);
    if (INFINITY <= value) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Float.POSITIVE_INFINITY";
      pcVar9 = "";
      goto LAB_001a21ce;
    }
    if (value <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Float.NEGATIVE_INFINITY";
      pcVar9 = "";
      goto LAB_001a21ce;
    }
    if (NAN(value)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "Float.NaN";
      pcVar9 = "";
      goto LAB_001a21ce;
    }
    SimpleFtoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,(protobuf *)this,value);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"F");
    local_1f0._M_dataplus._M_p = in_stack_fffffffffffffdd8._M_p;
    goto LAB_001a20b2;
  case 7:
    jVar1 = this[0x70];
    pcVar10 = "false";
    if ((ulong)(byte)jVar1 != 0) {
      pcVar10 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = pcVar10 + ((ulong)(byte)jVar1 ^ 5);
    goto LAB_001a21ce;
  case 8:
    ToJavaName((string *)local_1d0,*(string **)(*(long *)(this + 0x50) + 8),
               *(FileDescriptor **)(*(long *)(this + 0x50) + 0x10));
    plVar5 = (long *)std::__cxx11::string::append((char *)local_1d0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar8) {
      local_218[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_218[0]._8_8_ = plVar5[3];
      _Var12._M_p = (pointer)local_218;
    }
    else {
      local_218[0]._0_8_ = paVar8->_M_allocated_capacity;
      _Var12._M_p = (pointer)*plVar5;
    }
    *plVar5 = (long)paVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               (&stack0xfffffffffffffdd8,*(ulong *)**(undefined8 **)(this + 0x70));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p != local_218) {
LAB_001a24a9:
      operator_delete(_Var12._M_p,local_218[0]._M_allocated_capacity + 1);
    }
LAB_001a24b6:
    local_1f0.field_2._M_allocated_capacity = local_1d0._16_8_;
    local_1f0._M_dataplus._M_p = (pointer)local_1d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1d0 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_001a24c9;
  case 9:
    if (*(uint *)(this + 0x2c) == 0xc) {
      if (this[0x68] != (java)0x1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar10 = "com.google.protobuf.ByteString.EMPTY";
        pcVar9 = "";
        goto LAB_001a21ce;
      }
      CEscape(&local_1f0,*(string **)(this + 0x70));
      local_1d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1d0._8_4_ = -1;
      local_50.text_ = (char *)0x0;
      local_50.size_ = -1;
      local_80.text_ = (char *)0x0;
      local_80.size_ = -1;
      local_b0.text_ = (char *)0x0;
      local_b0.size_ = -1;
      local_e0.text_ = (char *)0x0;
      local_e0.size_ = -1;
      local_110.text_ = (char *)0x0;
      local_110.size_ = -1;
      local_140.text_ = (char *)0x0;
      local_140.size_ = -1;
      local_170.text_ = (char *)0x0;
      local_170.size_ = -1;
      local_1a0.text_ = (char *)0x0;
      local_1a0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
                 &stack0xfffffffffffffdd8,(SubstituteArg *)local_1d0,&local_50,&local_80,&local_b0,
                 &local_e0,&local_110,&local_140,&local_170,&local_1a0,
                 (SubstituteArg *)local_1f0._M_dataplus._M_p);
    }
    else {
      src = *(string **)(this + 0x70);
      uVar2 = src->_M_string_length;
      if (uVar2 == 0) {
LAB_001a24e3:
        CEscape((string *)local_1d0,src);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0x23cacb);
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 == paVar8) {
          local_218[0]._0_8_ = paVar8->_M_allocated_capacity;
          local_218[0]._8_8_ = puVar6[3];
          _Var12._M_p = (pointer)local_218;
        }
        else {
          local_218[0]._0_8_ = paVar8->_M_allocated_capacity;
          _Var12._M_p = (pointer)*puVar6;
        }
        *puVar6 = paVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdd8);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          lVar3 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var12._M_p != local_218) goto LAB_001a24a9;
        goto LAB_001a24b6;
      }
      pcVar9 = (src->_M_dataplus)._M_p;
      if (-1 < *pcVar9) {
        uVar4 = 1;
        do {
          uVar11 = uVar4;
          if (uVar2 == uVar11) break;
          uVar4 = uVar11 + 1;
        } while (-1 < pcVar9[uVar11]);
        if (uVar2 <= uVar11) goto LAB_001a24e3;
      }
      CEscape(&local_1f0,src);
      local_1d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1d0._8_4_ = -1;
      local_50.text_ = (char *)0x0;
      local_50.size_ = -1;
      local_80.text_ = (char *)0x0;
      local_80.size_ = -1;
      local_b0.text_ = (char *)0x0;
      local_b0.size_ = -1;
      local_e0.text_ = (char *)0x0;
      local_e0.size_ = -1;
      local_110.text_ = (char *)0x0;
      local_110.size_ = -1;
      local_140.text_ = (char *)0x0;
      local_140.size_ = -1;
      local_170.text_ = (char *)0x0;
      local_170.size_ = -1;
      local_1a0.text_ = (char *)0x0;
      local_1a0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
                 &stack0xfffffffffffffdd8,(SubstituteArg *)local_1d0,&local_50,&local_80,&local_b0,
                 &local_e0,&local_110,&local_140,&local_170,&local_1a0,
                 (SubstituteArg *)local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001a24c9;
  case 10:
    ToJavaName((string *)&stack0xfffffffffffffdd8,*(string **)(*(long *)(this + 0x48) + 8),
               *(FileDescriptor **)(*(long *)(this + 0x48) + 0x10));
    plVar5 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdd8);
    local_1f0._M_dataplus._M_p = in_stack_fffffffffffffdd8._M_p;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xfffffffffffffdd8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x165);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xfffffffffffffdd8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_1d0,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xfffffffffffffdd8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "";
    pcVar10 = "";
LAB_001a21ce:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar9)
    ;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
LAB_001a20b2:
  local_1f0.field_2._M_allocated_capacity = local_218[0]._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != local_218) {
LAB_001a24c9:
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
            "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
            CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return ClassName(field->enum_type()) + "." +
          field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return ClassName(field->message_type()) + ".getDefaultInstance()";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}